

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MapFieldBase::DeleteMapValue(MapFieldBase *this,MapKey *map_key)

{
  bool k;
  CppType CVar1;
  ViewType k_00;
  UntypedMapBase *this_00;
  size_type sVar2;
  ViewType_conflict k_01;
  string_view k_02;
  
  this_00 = MapFieldBaseForParse::MutableMap(&this->super_MapFieldBaseForParse);
  CVar1 = MapKey::type(map_key);
  switch(CVar1) {
  case CPPTYPE_INT32:
    k_00 = MapKey::GetInt32Value(map_key);
    break;
  case CPPTYPE_INT64:
    k_01 = MapKey::GetInt64Value(map_key);
    goto LAB_00ca49d8;
  case CPPTYPE_UINT32:
    k_00 = MapKey::GetUInt32Value(map_key);
    break;
  case CPPTYPE_UINT64:
    k_01 = MapKey::GetUInt64Value(map_key);
LAB_00ca49d8:
    sVar2 = KeyMapBase<unsigned_long>::EraseImpl((KeyMapBase<unsigned_long> *)this_00,k_01);
    goto LAB_00ca49e3;
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.cc"
                ,0x46);
  case CPPTYPE_BOOL:
    k = MapKey::GetBoolValue(map_key);
    sVar2 = KeyMapBase<bool>::EraseImpl((KeyMapBase<bool> *)this_00,k);
    goto LAB_00ca49e3;
  case CPPTYPE_STRING:
    k_02 = MapKey::GetStringValue(map_key);
    sVar2 = KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::EraseImpl((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00,k_02);
    goto LAB_00ca49e3;
  }
  sVar2 = KeyMapBase<unsigned_int>::EraseImpl((KeyMapBase<unsigned_int> *)this_00,k_00);
LAB_00ca49e3:
  return sVar2 != 0;
}

Assistant:

bool MapFieldBase::DeleteMapValue(const MapKey& map_key) {
  return VisitMapKey(map_key, *MutableMap(), [](auto& map, const auto& key) {
    return map.EraseImpl(key);
  });
}